

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTree.cpp
# Opt level: O2

void __thiscall
dgRedBackNode::RemoveFixup(dgRedBackNode *this,dgRedBackNode *thisNode,dgRedBackNode **head)

{
  dgRedBackNode *pdVar1;
  dgRedBackNode *pdVar2;
  byte bVar3;
  dgRedBackNode *pdVar4;
  dgRedBackNode *this_00;
  
LAB_00d9b610:
  this_00 = this;
  pdVar4 = *head;
  do {
    if (thisNode == pdVar4) {
      if (pdVar4 == (dgRedBackNode *)0x0) {
        return;
      }
      bVar3 = thisNode->field_0x20;
LAB_00d9b7c6:
      thisNode->field_0x20 = bVar3 & 0xfe;
      return;
    }
    if ((thisNode != (dgRedBackNode *)0x0) && (bVar3 = thisNode->field_0x20, (bVar3 & 1) != 0))
    goto LAB_00d9b7c6;
    pdVar4 = this_00->m_left;
    if (thisNode == pdVar4) {
      pdVar4 = this_00->m_right;
      if (pdVar4 == (dgRedBackNode *)0x0) {
        return;
      }
      if ((pdVar4->field_0x20 & 1) != 0) {
        pdVar4->field_0x20 = pdVar4->field_0x20 & 0xfe;
        this_00->field_0x20 = this_00->field_0x20 | 1;
        RotateLeft(this_00,head);
        pdVar4 = this_00->m_right;
        if (pdVar4 == (dgRedBackNode *)0x0) {
          return;
        }
      }
      pdVar1 = pdVar4->m_left;
      if ((pdVar1 == (dgRedBackNode *)0x0) || ((pdVar1->field_0x20 & 1) == 0)) {
        pdVar2 = pdVar4->m_right;
        if ((pdVar2 == (dgRedBackNode *)0x0) || ((pdVar2->field_0x20 & 1) == 0)) break;
LAB_00d9b758:
        if ((pdVar2->field_0x20 & 1) == 0) goto LAB_00d9b75e;
      }
      else {
        pdVar2 = pdVar4->m_right;
        if (pdVar2 != (dgRedBackNode *)0x0) goto LAB_00d9b758;
LAB_00d9b75e:
        pdVar1->field_0x20 = pdVar1->field_0x20 & 0xfe;
        pdVar4->field_0x20 = pdVar4->field_0x20 | 1;
        RotateRight(pdVar4,head);
        pdVar4 = this_00->m_right;
        if (pdVar4 == (dgRedBackNode *)0x0) {
          return;
        }
        pdVar2 = pdVar4->m_right;
      }
      pdVar4->field_0x20 = pdVar4->field_0x20 & 0xfe | this_00->field_0x20 & 1;
      if (pdVar2 != (dgRedBackNode *)0x0) {
        pdVar2->field_0x20 = pdVar2->field_0x20 & 0xfe;
      }
      this_00->field_0x20 = this_00->field_0x20 & 0xfe;
      RotateLeft(this_00,head);
    }
    else {
      if (pdVar4 == (dgRedBackNode *)0x0) {
        return;
      }
      if ((pdVar4->field_0x20 & 1) != 0) {
        pdVar4->field_0x20 = pdVar4->field_0x20 & 0xfe;
        this_00->field_0x20 = this_00->field_0x20 | 1;
        RotateRight(this_00,head);
        pdVar4 = this_00->m_left;
        if (pdVar4 == (dgRedBackNode *)0x0) {
          return;
        }
      }
      pdVar1 = pdVar4->m_right;
      if ((pdVar1 == (dgRedBackNode *)0x0) || ((pdVar1->field_0x20 & 1) == 0)) {
        pdVar2 = pdVar4->m_left;
        if ((pdVar2 == (dgRedBackNode *)0x0) || ((pdVar2->field_0x20 & 1) == 0)) break;
LAB_00d9b6fb:
        if ((pdVar2->field_0x20 & 1) == 0) goto LAB_00d9b701;
      }
      else {
        pdVar2 = pdVar4->m_left;
        if (pdVar2 != (dgRedBackNode *)0x0) goto LAB_00d9b6fb;
LAB_00d9b701:
        pdVar1->field_0x20 = pdVar1->field_0x20 & 0xfe;
        pdVar4->field_0x20 = pdVar4->field_0x20 | 1;
        RotateLeft(pdVar4,head);
        pdVar4 = this_00->m_left;
        if (pdVar4 == (dgRedBackNode *)0x0) {
          return;
        }
        pdVar2 = pdVar4->m_left;
      }
      pdVar4->field_0x20 = pdVar4->field_0x20 & 0xfe | this_00->field_0x20 & 1;
      if (pdVar2 != (dgRedBackNode *)0x0) {
        pdVar2->field_0x20 = pdVar2->field_0x20 & 0xfe;
      }
      this_00->field_0x20 = this_00->field_0x20 & 0xfe;
      RotateRight(this_00,head);
    }
    thisNode = *head;
    pdVar4 = thisNode;
  } while( true );
  pdVar4->field_0x20 = pdVar4->field_0x20 | 1;
  this = this_00->m_parent;
  thisNode = this_00;
  goto LAB_00d9b610;
}

Assistant:

void dgRedBackNode::RemoveFixup (dgRedBackNode* const thisNode, dgRedBackNode ** const head) 
{
	dgRedBackNode* ptr = this;
	dgRedBackNode* node = thisNode;
	while ((node != *head) && (!node || node->GetColor() == BLACK)) {
		if (node == ptr->m_left) {
			if (!ptr) {
				return;
			}
			dgRedBackNode* tmp = ptr->m_right;
			if (!tmp) {
				return;
			}
			if (tmp->GetColor() == RED) {
				tmp->SetColor(BLACK) ;
				ptr->SetColor(RED) ;
				ptr->RotateLeft (head);
				tmp = ptr->m_right;
				if (!ptr || !tmp) {
					return;
				}
			}
			if ((!tmp->m_left  || (tmp->m_left->GetColor() == BLACK)) && 
				 (!tmp->m_right || (tmp->m_right->GetColor() == BLACK))) {
				tmp->SetColor(RED);
				node = ptr;
				ptr = ptr->m_parent;
				continue;
			} else if (!tmp->m_right || (tmp->m_right->GetColor() == BLACK)) {
				tmp->m_left->SetColor(BLACK);
				tmp->SetColor(RED);
				tmp->RotateRight (head);
				tmp = ptr->m_right;
				if (!ptr || !tmp) {
					return;
				}
			}
			tmp->SetColor (ptr->GetColor());
			if (tmp->m_right) {
				tmp->m_right->SetColor(BLACK) ;
			}
			if (ptr) {
				ptr->SetColor(BLACK) ;
				ptr->RotateLeft (head);
			}
			node = *head;

		} else {
		  	if (!ptr) {
				return;
		  	}
			dgRedBackNode* tmp = ptr->m_left;
			if (!tmp) {
				return;
			}
			if (tmp->GetColor() == RED) {
				tmp->SetColor(BLACK) ;
				ptr->SetColor(RED) ;
				ptr->RotateRight (head);
				tmp = ptr->m_left;
				if (!ptr || !tmp) {
					return;
				}
			}

			if ((!tmp->m_right || (tmp->m_right->GetColor() == BLACK)) && 
				 (!tmp->m_left  || (tmp->m_left->GetColor() == BLACK))) {
				tmp->SetColor(RED) ;
				node = ptr;
				ptr = ptr->m_parent;
				continue;
			} else if (!tmp->m_left || (tmp->m_left->GetColor() == BLACK)) {
				tmp->m_right->SetColor(BLACK) ;
				tmp->SetColor(RED) ;
				tmp->RotateLeft (head);
				tmp = ptr->m_left;
				if (!ptr || !tmp) {
					return;
				}
			}
			tmp->SetColor (ptr->GetColor());
			if (tmp->m_left) {
				tmp->m_left->SetColor(BLACK);
			}
			if (ptr) {
				ptr->SetColor(BLACK) ;
				ptr->RotateRight (head);
			}
			node = *head;
		}
	}
	if (node) {
		node->SetColor(BLACK);
	}
}